

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
PlanningUnitMADPDiscrete::GetNrObservationHistoriesVector
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          PlanningUnitMADPDiscrete *this)

{
  iterator __position;
  int iVar1;
  size_t in_RAX;
  undefined4 extraout_var;
  Index agentI;
  ulong uVar2;
  size_t local_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0;
  local_28 = in_RAX;
  while( true ) {
    iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
    if (CONCAT44(extraout_var,iVar1) <= uVar2) break;
    local_28 = GetNrObservationHistories(this,(Index)uVar2);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (__return_storage_ptr__,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar2 = (ulong)((Index)uVar2 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<size_t> PlanningUnitMADPDiscrete::GetNrObservationHistoriesVector() const
{
    vector<size_t> nrOHts; 
    for(Index agentI = 0; agentI < GetNrAgents(); agentI++)
        nrOHts.push_back( GetNrObservationHistories(agentI) );
    return nrOHts;
}